

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.c
# Opt level: O3

apx_error_t rmf_fileInfo_create_copy(rmf_fileInfo_t *self,rmf_fileInfo_t *other)

{
  uint32_t uVar1;
  adt_error_t error_code;
  apx_error_t aVar2;
  size_t __n;
  
  if (self == (rmf_fileInfo_t *)0x0) {
    aVar2 = 1;
  }
  else {
    uVar1 = other->size;
    self->address = other->address;
    self->size = uVar1;
    self->rmf_file_type = other->rmf_file_type;
    self->digest_type = other->digest_type;
    adt_str_create(&self->name);
    error_code = adt_str_set(&self->name,&other->name);
    if (error_code != '\0') {
      aVar2 = convert_from_adt_to_apx_error(error_code);
      return aVar2;
    }
    if (other->digest_type == '\0') {
      self->digest_data[0x10] = '\0';
      self->digest_data[0x11] = '\0';
      self->digest_data[0x12] = '\0';
      self->digest_data[0x13] = '\0';
      self->digest_data[0x14] = '\0';
      self->digest_data[0x15] = '\0';
      self->digest_data[0x16] = '\0';
      self->digest_data[0x17] = '\0';
      self->digest_data[0x18] = '\0';
      self->digest_data[0x19] = '\0';
      self->digest_data[0x1a] = '\0';
      self->digest_data[0x1b] = '\0';
      self->digest_data[0x1c] = '\0';
      self->digest_data[0x1d] = '\0';
      self->digest_data[0x1e] = '\0';
      self->digest_data[0x1f] = '\0';
      self->digest_data[0] = '\0';
      self->digest_data[1] = '\0';
      self->digest_data[2] = '\0';
      self->digest_data[3] = '\0';
      self->digest_data[4] = '\0';
      self->digest_data[5] = '\0';
      self->digest_data[6] = '\0';
      self->digest_data[7] = '\0';
      self->digest_data[8] = '\0';
      self->digest_data[9] = '\0';
      self->digest_data[10] = '\0';
      self->digest_data[0xb] = '\0';
      self->digest_data[0xc] = '\0';
      self->digest_data[0xd] = '\0';
      self->digest_data[0xe] = '\0';
      self->digest_data[0xf] = '\0';
    }
    else {
      __n = 0x20;
      if (other->digest_type == '\x01') {
        __n = 0x14;
      }
      memcpy(self->digest_data,other->digest_data,__n);
    }
    aVar2 = 0;
  }
  return aVar2;
}

Assistant:

apx_error_t rmf_fileInfo_create_copy(rmf_fileInfo_t* self, rmf_fileInfo_t const* other)
{
   if (self != NULL)
   {
      adt_error_t result;
      self->address = other->address;
      self->size = other->size;
      self->rmf_file_type = other->rmf_file_type;
      self->digest_type = other->digest_type;
      adt_str_create(&self->name);
      result = adt_str_set(&self->name, &other->name);
      if (result != ADT_NO_ERROR)
      {
         return convert_from_adt_to_apx_error(result);
      }
      return rmf_fileInfo_set_digest_data(self, other->digest_type, &other->digest_data[0]);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}